

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

char * toLocalFormat(char *name)

{
  char cVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *__ptr;
  void *pvVar4;
  ushort uVar5;
  ushort uVar6;
  in_addr_t iVar7;
  uint uVar8;
  char *pcVar9;
  DNSRr *pDVar10;
  DNSRr *pDVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  void *pvVar16;
  DNSQuery *__src;
  void *pvVar17;
  ushort uVar18;
  char *pcVar19;
  int iVar20;
  DNSRr *in_RSI;
  DNSRr *pDVar21;
  long *plVar22;
  long lVar23;
  char *pcVar24;
  char *name_00;
  ushort *puVar25;
  DNSRr *unaff_R12;
  ulong uVar26;
  DNSRr *pDVar27;
  ushort *dnsQuery;
  size_t sVar28;
  ushort unaff_retaddr;
  undefined2 unaff_retaddr_00;
  ushort unaff_retaddr_01;
  ushort unaff_retaddr_02;
  undefined2 uStack0000000000000008;
  ushort uStack000000000000000a;
  DNSQuery *in_stack_00000010;
  DNSRr *in_stack_00000018;
  DNSRr *in_stack_00000028;
  int iStack_1b4;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  void *pvStack_1a8;
  void *pvStack_1a0;
  uint uStack_194;
  DNSRr *pDStack_190;
  char *pcStack_188;
  char *pcStack_180;
  char *pcStack_178;
  size_t sStack_170;
  code *pcStack_168;
  DNSRr *pDStack_158;
  char *pcStack_150;
  char *pcStack_148;
  char *pcStack_140;
  size_t sStack_138;
  code *pcStack_130;
  size_t sStack_120;
  size_t sStack_118;
  char *pcStack_110;
  char *pcStack_108;
  size_t sStack_100;
  code *pcStack_f8;
  char *pcStack_e8;
  DNSRr *pDStack_e0;
  DNSRr *pDStack_d8;
  size_t sStack_d0;
  char *pcStack_c8;
  char *pcStack_c0;
  DNSRr *pDStack_b8;
  code *pcStack_b0;
  long *plStack_a0;
  DNSRr *pDStack_98;
  DNSRr *pDStack_90;
  DNSRr *pDStack_88;
  DNSRr *pDStack_80;
  code *pcStack_78;
  undefined1 auStack_6c [44];
  undefined8 *puStack_40;
  char *pcStack_38;
  
  plVar22 = (long *)0x100;
  pcVar9 = (char *)malloc(0x100);
  if (pcVar9 != (char *)0x0) {
    cVar1 = *name;
    pcVar19 = pcVar9;
    while (cVar1 != '\0') {
      name = name + 1;
      if ('\0' < cVar1) {
        iVar20 = (int)cVar1;
        do {
          *pcVar19 = *name;
          pcVar19 = pcVar19 + 1;
          name = name + 1;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
      *pcVar19 = '.';
      pcVar19 = pcVar19 + 1;
      cVar1 = *name;
    }
    pcVar19[-1] = '\0';
    return pcVar9;
  }
  toLocalFormat_cold_1();
  *plVar22 = 0xc;
  uVar26 = (ulong)unaff_retaddr_01;
  auStack_6c._12_8_ = ZEXT28(unaff_retaddr_02);
  auStack_6c._4_8_ = ZEXT28(uStack000000000000000a);
  puStack_40 = (undefined8 *)0x0;
  auStack_6c._20_8_ = uVar26;
  pcStack_38 = name;
  if (uVar26 == 0) {
    pDVar10 = (DNSRr *)(auStack_6c + 0x1c);
    lVar23 = 0xc;
  }
  else {
    unaff_R12 = (DNSRr *)auStack_6c;
    pDVar11 = (DNSRr *)(auStack_6c + 0x1c);
    do {
      pcStack_78 = (code *)0x102010;
      pDVar10 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar11->name + 0x10) = pDVar10;
      pcStack_78 = (code *)0x102022;
      in_RSI = unaff_R12;
      pcVar9 = serilizeQuery(in_stack_00000010,(int *)unaff_R12);
      *(char **)pDVar10->name = pcVar9;
      *(long *)(pDVar10->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar10->name[0x10] = '\0';
      pDVar10->name[0x11] = '\0';
      pDVar10->name[0x12] = '\0';
      pDVar10->name[0x13] = '\0';
      pDVar10->name[0x14] = '\0';
      pDVar10->name[0x15] = '\0';
      pDVar10->name[0x16] = '\0';
      pDVar10->name[0x17] = '\0';
      lVar23 = (long)(int)auStack_6c._0_4_ + *plVar22;
      *plVar22 = lVar23;
      in_stack_00000010 = in_stack_00000010 + 1;
      uVar26 = uVar26 - 1;
      pDVar11 = pDVar10;
    } while (uVar26 != 0);
  }
  pDVar11 = (DNSRr *)0x0;
  if (auStack_6c._12_8_ != 0) {
    pDVar11 = (DNSRr *)auStack_6c;
    uVar26 = auStack_6c._12_8_;
    pDVar27 = pDVar10;
    do {
      pcStack_78 = (code *)0x102079;
      pDVar10 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar27->name + 0x10) = pDVar10;
      pcStack_78 = (code *)0x10208b;
      in_RSI = pDVar11;
      pcVar9 = serilizeRr(in_stack_00000018,(int *)pDVar11);
      *(char **)pDVar10->name = pcVar9;
      *(long *)(pDVar10->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar10->name[0x10] = '\0';
      pDVar10->name[0x11] = '\0';
      pDVar10->name[0x12] = '\0';
      pDVar10->name[0x13] = '\0';
      pDVar10->name[0x14] = '\0';
      pDVar10->name[0x15] = '\0';
      pDVar10->name[0x16] = '\0';
      pDVar10->name[0x17] = '\0';
      lVar23 = (long)(int)auStack_6c._0_4_ + *plVar22;
      *plVar22 = lVar23;
      in_stack_00000018 = in_stack_00000018 + 1;
      uVar26 = uVar26 - 1;
      unaff_R12 = in_stack_00000018;
      pDVar27 = pDVar10;
    } while (uVar26 != 0);
  }
  uVar26 = 0;
  pDVar27 = pDVar10;
  if (auStack_6c._4_8_ != 0) {
    unaff_R12 = (DNSRr *)auStack_6c;
    uVar26 = auStack_6c._4_8_;
    do {
      pcStack_78 = (code *)0x1020de;
      pDVar11 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar27->name + 0x10) = pDVar11;
      pcStack_78 = (code *)0x1020f0;
      in_RSI = unaff_R12;
      pcVar9 = serilizeRr(in_stack_00000028,(int *)unaff_R12);
      *(char **)pDVar11->name = pcVar9;
      *(long *)(pDVar11->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar11->name[0x10] = '\0';
      pDVar11->name[0x11] = '\0';
      pDVar11->name[0x12] = '\0';
      pDVar11->name[0x13] = '\0';
      pDVar11->name[0x14] = '\0';
      pDVar11->name[0x15] = '\0';
      pDVar11->name[0x16] = '\0';
      pDVar11->name[0x17] = '\0';
      lVar23 = (long)(int)auStack_6c._0_4_ + *plVar22;
      *plVar22 = lVar23;
      pDVar10 = in_stack_00000028 + 1;
      uVar26 = uVar26 - 1;
      in_stack_00000028 = pDVar10;
      pDVar27 = pDVar11;
    } while (uVar26 != 0);
  }
  pcVar19 = (char *)(lVar23 + 10);
  pcStack_78 = (code *)0x102123;
  pcVar9 = (char *)malloc((size_t)pcVar19);
  if (pcVar9 != (char *)0x0) {
    _uStack0000000000000008 =
         CONCAT22((ushort)auStack_6c._4_8_ << 8 | (ushort)auStack_6c._4_8_ >> 8,
                  uStack0000000000000008);
    *(undefined4 *)(pcVar9 + 8) = _uStack0000000000000008;
    *(ulong *)pcVar9 =
         CONCAT26((ushort)auStack_6c._12_8_ << 8 | (ushort)auStack_6c._12_8_ >> 8,
                  CONCAT24((ushort)auStack_6c._20_8_ << 8 | (ushort)auStack_6c._20_8_ >> 8,
                           CONCAT22(unaff_retaddr_00,unaff_retaddr << 8 | unaff_retaddr >> 8)));
    pcVar19 = pcVar9 + 0xc;
    __ptr = puStack_40;
    while (__ptr != (undefined8 *)0x0) {
      pvVar16 = (void *)*__ptr;
      sVar13 = __ptr[1];
      pcStack_78 = (code *)0x102191;
      memcpy(pcVar19,pvVar16,sVar13);
      pcVar19 = pcVar19 + sVar13;
      pcStack_78 = (code *)0x10219c;
      free(pvVar16);
      puVar3 = (undefined8 *)__ptr[2];
      pcStack_78 = (code *)0x1021a9;
      free(__ptr);
      __ptr = puVar3;
    }
    *plVar22 = (long)pcVar19 - (long)pcVar9;
    return pcVar9;
  }
  pcStack_78 = serilizeQuery;
  serilizeDNS_cold_1();
  pcStack_b0 = (code *)0x1021e4;
  pDVar21 = in_RSI;
  plStack_a0 = plVar22;
  pDStack_98 = unaff_R12;
  pDStack_90 = pDVar11;
  pDStack_88 = pDVar10;
  pDStack_80 = pDVar27;
  pcStack_78 = (code *)uVar26;
  pcVar12 = toInternetFormat(pcVar19);
  pcStack_b0 = (code *)0x1021ef;
  sVar13 = strlen(pcVar12);
  pcVar9 = (char *)(sVar13 + 6);
  pcStack_b0 = (code *)0x1021fb;
  pcVar14 = (char *)malloc((size_t)pcVar9);
  if (pcVar14 != (char *)0x0) {
    pcStack_b0 = (code *)0x10220e;
    strcpy(pcVar14,pcVar12);
    pcStack_b0 = (code *)0x10221c;
    free(pcVar12);
    *(ushort *)(pcVar14 + sVar13 + 1) =
         *(ushort *)(pcVar19 + 0x100) << 8 | *(ushort *)(pcVar19 + 0x100) >> 8;
    *(ushort *)(pcVar14 + sVar13 + 3) =
         *(ushort *)(pcVar19 + 0x102) << 8 | *(ushort *)(pcVar19 + 0x102) >> 8;
    *(int *)in_RSI->name = (int)sVar13 + 5;
    return pcVar14;
  }
  pcStack_b0 = serilizeRr;
  serilizeQuery_cold_1();
  pcStack_f8 = (code *)0x10227a;
  pDStack_e0 = pDVar21;
  pDStack_d8 = in_RSI;
  sStack_d0 = sVar13;
  pcStack_c8 = pcVar12;
  pcStack_c0 = pcVar19;
  pDStack_b8 = pDVar27;
  pcStack_b0 = (code *)uVar26;
  pcVar12 = toInternetFormat(pcVar9);
  if (*(short *)(pcVar9 + 0x100) == 1) {
    sVar28 = 4;
  }
  else {
    pcStack_f8 = (code *)0x10229c;
    pcStack_e8 = toInternetFormat(pcVar9 + 0x10a);
    pcStack_f8 = (code *)0x1022a9;
    sVar28 = strlen(pcStack_e8);
  }
  pcStack_f8 = (code *)0x1022b4;
  sVar15 = strlen(pcVar12);
  iVar20 = (int)sVar28;
  pcVar24 = (char *)((long)iVar20 + sVar15 + 0xe);
  pcStack_f8 = (code *)0x1022c7;
  pcVar14 = (char *)malloc((size_t)pcVar24);
  if (pcVar14 == (char *)0x0) {
    pcStack_f8 = deserilizeQuery;
    serilizeRr_cold_1();
    pcStack_130 = (code *)0x1023ea;
    pDVar10 = pDVar21;
    sStack_120 = sVar15;
    sStack_118 = sVar13;
    pcStack_110 = pcVar9;
    pcStack_108 = pcVar19;
    sStack_100 = sVar28;
    pcStack_f8 = (code *)pcVar12;
    pcVar19 = toLocalFormat(pcVar24);
    name_00 = (char *)0x104;
    pcStack_130 = (code *)0x1023f7;
    pcVar14 = (char *)malloc(0x104);
    if (pcVar14 != (char *)0x0) {
      pcStack_130 = (code *)0x10240a;
      strcpy(pcVar14,pcVar19);
      pcStack_130 = (code *)0x102412;
      sVar13 = strlen(pcVar24);
      pcStack_130 = (code *)0x102421;
      free(pcVar19);
      *(ushort *)(pcVar14 + 0x100) =
           *(ushort *)(pcVar24 + sVar13 + 1) << 8 | *(ushort *)(pcVar24 + sVar13 + 1) >> 8;
      *(ushort *)(pcVar14 + 0x102) =
           *(ushort *)(pcVar24 + sVar13 + 3) << 8 | *(ushort *)(pcVar24 + sVar13 + 3) >> 8;
      *(int *)pDVar21->name = (int)sVar13 + 5;
      return pcVar14;
    }
    pcStack_130 = deserilizeRr;
    deserilizeQuery_cold_1();
    pcStack_168 = (code *)0x10247a;
    pDVar11 = pDVar10;
    pDStack_158 = pDVar21;
    pcStack_150 = pcVar19;
    pcStack_148 = pcVar9;
    pcStack_140 = pcVar24;
    sStack_138 = sVar28;
    pcStack_130 = (code *)pcVar12;
    pcVar9 = toLocalFormat(name_00);
    puVar25 = (ushort *)0x20e;
    pcStack_168 = (code *)0x102487;
    pcVar14 = (char *)malloc(0x20e);
    if (pcVar14 == (char *)0x0) {
      pcStack_168 = deserializeDNS;
      deserilizeRr_cold_1();
      if (((DNSRr *)0xb < pDVar11) && (uStack_194 = (uint)puVar25[1], (puVar25[1] & 0x7078) == 0)) {
        uStack_1aa = puVar25[4];
        dnsQuery = puVar25 + 6;
        pvStack_1a0 = (void *)CONCAT62(pvStack_1a0._2_6_,puVar25[5]);
        uVar5 = puVar25[3];
        uVar2 = *puVar25;
        uVar6 = puVar25[2];
        uVar18 = uVar6 << 8 | uVar6 >> 8;
        uStack_1ac = uVar18;
        pDStack_190 = pDVar10;
        pcStack_188 = pcVar19;
        pcStack_180 = pcVar9;
        pcStack_178 = name_00;
        sStack_170 = sVar28;
        pcStack_168 = (code *)pcVar12;
        if (uVar6 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          pvStack_1a8 = (void *)CONCAT62(pvStack_1a8._2_6_,uVar5);
          pvVar16 = malloc((ulong)uVar18 * 0x100 + (ulong)uVar18 * 4);
          uVar8 = 1;
          if (1 < uVar18) {
            uVar8 = (uint)uVar18;
          }
          lVar23 = 0;
          do {
            __src = deserilizeQuery((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar16 + lVar23),__src,0x104);
            dnsQuery = (ushort *)((long)iStack_1b4 + (long)dnsQuery);
            free(__src);
            lVar23 = lVar23 + 0x104;
          } while ((ulong)(uVar8 << 8) + (ulong)uVar8 * 4 != lVar23);
          uVar5 = (ushort)pvStack_1a8;
        }
        uVar6 = uVar5 << 8 | uVar5 >> 8;
        uStack_1ae = uVar6;
        pvStack_1a8 = pvVar16;
        if (uVar5 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          pvVar16 = malloc((ulong)uVar6 * 0x20c);
          uVar5 = 1;
          if (1 < uVar6) {
            uVar5 = uVar6;
          }
          lVar23 = 0;
          do {
            pDVar10 = deserilizeRr((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar16 + lVar23),pDVar10,0x20c);
            dnsQuery = (ushort *)((long)iStack_1b4 + (long)dnsQuery);
            free(pDVar10);
            lVar23 = lVar23 + 0x20c;
          } while ((ulong)uVar5 * 0x20c - lVar23 != 0);
        }
        uVar5 = (ushort)pvStack_1a0 << 8 | (ushort)pvStack_1a0 >> 8;
        if ((ushort)pvStack_1a0 == 0) {
          pvVar17 = (void *)0x0;
        }
        else {
          uStack_1b0 = uVar5;
          pvStack_1a0 = pvVar16;
          pvVar17 = malloc((ulong)uVar5 * 0x20c);
          uVar6 = 1;
          if (1 < uVar5) {
            uVar6 = uVar5;
          }
          lVar23 = 0;
          do {
            pDVar10 = deserilizeRr((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar17 + lVar23),pDVar10,0x20c);
            dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_1b4);
            free(pDVar10);
            lVar23 = lVar23 + 0x20c;
            pvVar16 = pvStack_1a0;
            uVar5 = uStack_1b0;
          } while ((ulong)uVar6 * 0x20c - lVar23 != 0);
        }
        pvVar4 = pvStack_1a8;
        puVar25 = (ushort *)malloc(0x30);
        *puVar25 = uVar2 << 8 | uVar2 >> 8;
        puVar25[1] = (ushort)uStack_194;
        puVar25[2] = uStack_1ac;
        puVar25[3] = uStack_1ae;
        puVar25[4] = uStack_1aa;
        puVar25[5] = uVar5;
        puVar25[6] = 0;
        puVar25[7] = 0;
        *(void **)(puVar25 + 8) = pvVar4;
        *(void **)(puVar25 + 0xc) = pvVar16;
        puVar25[0x10] = 0;
        puVar25[0x11] = 0;
        puVar25[0x12] = 0;
        puVar25[0x13] = 0;
        *(void **)(puVar25 + 0x14) = pvVar17;
        return (char *)puVar25;
      }
      return (char *)0x0;
    }
    pcStack_168 = (code *)0x10249e;
    strcpy(pcVar14,pcVar9);
    pcStack_168 = (code *)0x1024a6;
    sVar13 = strlen(name_00);
    pcVar19 = name_00 + sVar13;
    pcStack_168 = (code *)0x1024b5;
    free(pcVar9);
    uVar5 = *(ushort *)(name_00 + sVar13 + 1) << 8 | *(ushort *)(name_00 + sVar13 + 1) >> 8;
    *(ushort *)(pcVar14 + 0x100) = uVar5;
    *(ushort *)(pcVar14 + 0x102) =
         *(ushort *)(name_00 + sVar13 + 3) << 8 | *(ushort *)(name_00 + sVar13 + 3) >> 8;
    uVar8 = *(uint *)(name_00 + sVar13 + 5);
    *(uint *)(pcVar14 + 0x104) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    *(ushort *)(pcVar14 + 0x108) =
         *(ushort *)(name_00 + sVar13 + 9) << 8 | *(ushort *)(name_00 + sVar13 + 9) >> 8;
    if (uVar5 == 0xf) {
      pcStack_168 = (code *)0x102540;
      pcVar9 = toLocalFormat(pcVar19 + 0xd);
      pcStack_168 = (code *)0x10254b;
      strcpy(pcVar14 + 0x10a,pcVar9);
      pcStack_168 = (code *)0x102553;
      sVar13 = strlen(pcVar19 + 0xd);
      iVar20 = (int)pcVar19 + (int)sVar13 + 0xe;
    }
    else if (uVar5 == 1) {
      pcStack_168 = (code *)0x102519;
      pcVar9 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar19 + 0xb));
      pcStack_168 = (code *)0x102524;
      strcpy(pcVar14 + 0x10a,pcVar9);
      iVar20 = (int)pcVar19 + 0xf;
    }
    else {
      pcVar19 = name_00 + sVar13 + 0xb;
      pcStack_168 = (code *)0x102575;
      pcVar9 = toLocalFormat(pcVar19);
      pcStack_168 = (code *)0x102580;
      strcpy(pcVar14 + 0x10a,pcVar9);
      pcStack_168 = (code *)0x102588;
      sVar13 = strlen(pcVar19);
      iVar20 = (int)pcVar19 + (int)sVar13 + 1;
    }
    *(int *)pDVar10->name = iVar20 - (int)name_00;
    return pcVar14;
  }
  pcStack_f8 = (code *)0x1022de;
  strcpy(pcVar14,pcVar12);
  pcVar24 = pcVar14 + sVar15;
  pcStack_f8 = (code *)0x1022ec;
  free(pcVar12);
  pcVar19 = pcStack_e8;
  uVar5 = *(ushort *)(pcVar9 + 0x100);
  *(ushort *)(pcVar14 + sVar15 + 1) = uVar5 << 8 | uVar5 >> 8;
  *(ushort *)(pcVar14 + sVar15 + 3) =
       *(ushort *)(pcVar9 + 0x102) << 8 | *(ushort *)(pcVar9 + 0x102) >> 8;
  uVar8 = *(uint *)(pcVar9 + 0x104);
  *(uint *)(pcVar14 + sVar15 + 5) =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar2 = (ushort)sVar28;
  if (uVar5 == 1) {
    *(ushort *)(pcVar24 + 9) = uVar2 << 8 | uVar2 >> 8;
    pcStack_f8 = (code *)0x102364;
    iVar7 = inet_addr(pcVar9 + 0x10a);
    *(in_addr_t *)(pcVar24 + 0xb) = iVar7;
    lVar23 = 0xb;
  }
  else {
    if (uVar5 == 0xf) {
      *(ushort *)(pcVar24 + 9) = (uVar2 + 3) * 0x100 | (ushort)(uVar2 + 3) >> 8;
      pcVar24[0xb] = '\0';
      pcVar24[0xc] = '\x05';
      lVar23 = 0xd;
    }
    else {
      *(ushort *)(pcVar24 + 9) = (uVar2 + 1) * 0x100 | (ushort)(uVar2 + 1) >> 8;
      lVar23 = 0xb;
    }
    pcStack_f8 = (code *)0x1023a5;
    memcpy(pcVar24 + lVar23,pcStack_e8,(long)(iVar20 + 1));
    pcStack_f8 = (code *)0x1023ad;
    free(pcVar19);
  }
  *(int *)pDStack_e0->name = (iVar20 + 1 + (int)lVar23 + (int)pcVar24) - (int)pcVar14;
  return pcVar14;
}

Assistant:

char *toLocalFormat(char *name)
{

    char *result = (char *) malloc(256);
    checkMalloc(result);
    char *ptr = result;
    while (*name)
    {
        int p = *name++;
        for (int j = 0; j < (int) p; ++j)
        {

            *ptr++ = *name++;
        }
        *ptr++ = '.';
    }
    *--ptr = '\0';
    return result;
}